

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<void> __thiscall kj::anon_unknown_123::AsyncTee::pull(AsyncTee *this)

{
  SourceLocation location;
  SourceLocation local_40;
  AsyncTee *this_local;
  
  this_local = this;
  pullLoop((AsyncTee *)&stack0xffffffffffffffe0);
  SourceLocation::SourceLocation
            (&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
             ,&DAT_00a7ac3d,0x858,0xc);
  location.function = local_40.function;
  location.fileName = local_40.fileName;
  location.lineNumber = local_40.lineNumber;
  location.columnNumber = local_40.columnNumber;
  Promise<void>::
  eagerlyEvaluate<kj::(anonymous_namespace)::AsyncTee::pull()::_lambda(kj::Exception&&)_1_>
            ((Promise<void> *)this,(Type *)&stack0xffffffffffffffe0,location);
  Promise<void>::~Promise((Promise<void> *)&stack0xffffffffffffffe0);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<void> pull() {
    return pullLoop().eagerlyEvaluate([this](Exception&& exception) {
      // Exception from our loop, not from inner tryRead(). Something is broken; tell everybody!
      pulling = false;
      for (auto& branch: branches) {
        KJ_IF_SOME(sink, branch.sink) {
          sink.reject(KJ_EXCEPTION(FAILED, "Exception in tee loop", exception));
        }
      }
    });
  }